

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

_Bool trans_BLX_r(DisasContext_conflict1 *s,arg_BLX_r *a)

{
  TCGContext_conflict1 *tcg_ctx_00;
  int iVar1;
  TCGv_i32 var;
  TCGv_i32 tmp;
  TCGContext_conflict1 *tcg_ctx;
  arg_BLX_r *a_local;
  DisasContext_conflict1 *s_local;
  
  tcg_ctx_00 = s->uc->tcg_ctx;
  iVar1 = arm_dc_feature(s,0xf);
  if (iVar1 != 0) {
    var = load_reg(s,a->rm);
    tcg_gen_movi_i32(tcg_ctx_00,tcg_ctx_00->cpu_R[0xe],(uint)(s->base).pc_next | s->thumb);
    gen_bx(s,var);
  }
  return iVar1 != 0;
}

Assistant:

static bool trans_BLX_r(DisasContext *s, arg_BLX_r *a)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    TCGv_i32 tmp;

    if (!ENABLE_ARCH_5) {
        return false;
    }
    tmp = load_reg(s, a->rm);
    tcg_gen_movi_i32(tcg_ctx, tcg_ctx->cpu_R[14], s->base.pc_next | s->thumb);
    gen_bx(s, tmp);
    return true;
}